

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

void nifti_image_write(nifti_image *nim)

{
  znzFile __ptr;
  
  __ptr = nifti_image_write_hdr_img2(nim,1,"wb",(znzFile)0x0,(nifti_brick_list *)0x0);
  if (__ptr != (znzFile)0x0) {
    if (2 < g_opts_0) {
      nifti_image_write_cold_1();
    }
    free(__ptr);
  }
  if (1 < g_opts_0) {
    nifti_image_write_cold_2();
  }
  return;
}

Assistant:

void nifti_image_write( nifti_image *nim )
{
   znzFile fp = nifti_image_write_hdr_img(nim,1,"wb");
   if( fp ){
      if( g_opts.debug > 2 ) fprintf(stderr,"-d niw: done with znzFile\n");
      free(fp);
   }
   if( g_opts.debug > 1 ) fprintf(stderr,"-d nifti_image_write: done\n");
}